

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O2

string * __thiscall
ItemWrapper::getItemName_abi_cxx11_(string *__return_storage_ptr__,ItemWrapper *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->itemName);
  return __return_storage_ptr__;
}

Assistant:

std::string ItemWrapper::getItemName() {
    return itemName;
}